

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::BerdyDynamicVariable::operator==(BerdyDynamicVariable *this,BerdyDynamicVariable *v)

{
  size_t __n;
  int iVar1;
  
  if ((v->type == this->type) &&
     (__n = (v->id)._M_string_length, __n == (this->id)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((v->id)._M_dataplus._M_p,(this->id)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool BerdyDynamicVariable::operator==(const struct BerdyDynamicVariable &v) const
{
    return v.type == this->type
    && v.id == this->id;
}